

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_DRBG.c
# Opt level: O1

_Bool generate_sha2_512(uint8_t *output,EverCrypt_DRBG_state_s *st,uint32_t n,
                       uint8_t *additional_input,uint32_t additional_input_len)

{
  uint8_t *puVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  size_t __n;
  uint *puVar9;
  undefined1 *puVar10;
  char cVar11;
  uint32_t uVar12;
  undefined4 in_register_00000014;
  ulong uVar13;
  undefined8 uVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint8_t *puVar21;
  uint8_t *dst;
  uint data_len;
  uint8_t *puVar22;
  uint8_t auStack_b0 [8];
  uint8_t *local_a8;
  ulong local_a0;
  uint8_t *local_98;
  uint32_t *local_90;
  uint8_t *local_88;
  long local_80;
  uint8_t *local_78;
  ulong local_70;
  undefined8 local_68;
  uint *local_60;
  uint8_t *local_58;
  uint8_t *local_50;
  long local_48;
  undefined1 *local_40;
  char local_31;
  
  local_48 = CONCAT44(in_register_00000014,n);
  cVar11 = '\0';
  if ((additional_input_len <= Hacl_HMAC_DRBG_max_additional_input_length) &&
     (cVar11 = '\0', n <= Hacl_HMAC_DRBG_max_output_length)) {
    uVar19 = (ulong)additional_input_len;
    auStack_b0[0] = 0x90;
    auStack_b0[1] = 0x86;
    auStack_b0[2] = '\x17';
    auStack_b0[3] = '\0';
    auStack_b0[4] = '\0';
    auStack_b0[5] = '\0';
    auStack_b0[6] = '\0';
    auStack_b0[7] = '\0';
    local_78 = output;
    local_68 = st;
    uVar12 = Hacl_HMAC_DRBG_min_length('\x03');
    uVar18 = (ulong)uVar12;
    lVar2 = -(uVar18 + 0xf & 0xfffffffffffffff0);
    puVar21 = (uint8_t *)((long)&local_a8 + lVar2);
    puVar15 = auStack_b0 + lVar2;
    local_40 = (undefined1 *)&local_a8;
    puVar15[0] = 0xb7;
    puVar15[1] = 0x86;
    puVar15[2] = '\x17';
    puVar15[3] = '\0';
    puVar15[4] = '\0';
    puVar15[5] = '\0';
    puVar15[6] = '\0';
    puVar15[7] = '\0';
    memset(puVar21,0,uVar18);
    puVar16 = auStack_b0 + lVar2;
    builtin_memcpy(auStack_b0 + lVar2,"F\x17",4);
    puVar16[4] = '\0';
    puVar16[5] = '\0';
    puVar16[6] = '\0';
    puVar16[7] = '\0';
    local_31 = Lib_RandomBuffer_System_randombytes(puVar21,uVar12);
    cVar11 = local_31;
    if ((bool)local_31) {
      local_88 = (local_68->field_1).case_SHA1_s.k;
      puVar1 = (local_68->field_1).case_SHA1_s.v;
      local_90 = (local_68->field_1).case_SHA1_s.reseed_counter;
      uVar13 = (ulong)(uVar12 + additional_input_len);
      local_80 = CONCAT71(local_80._1_7_,local_68->tag);
      puVar17 = puVar21 + -(uVar13 + 0xf & 0xfffffffffffffff0);
      local_60 = (uint *)uVar13;
      local_58 = additional_input;
      puVar17[-8] = '\x13';
      puVar17[-7] = 0x87;
      puVar17[-6] = '\x17';
      puVar17[-5] = '\0';
      puVar17[-4] = '\0';
      puVar17[-3] = '\0';
      puVar17[-2] = '\0';
      puVar17[-1] = '\0';
      memset(puVar17,0,uVar13);
      puVar17[-8] = '!';
      puVar17[-7] = 0x87;
      puVar17[-6] = '\x17';
      puVar17[-5] = '\0';
      puVar17[-4] = '\0';
      puVar17[-3] = '\0';
      puVar17[-2] = '\0';
      puVar17[-1] = '\0';
      memcpy(puVar17,puVar21,uVar18);
      puVar21 = local_58;
      local_98 = puVar17;
      local_70 = uVar19;
      puVar17[-8] = '<';
      puVar17[-7] = 0x87;
      puVar17[-6] = '\x17';
      puVar17[-5] = '\0';
      puVar17[-4] = '\0';
      puVar17[-3] = '\0';
      puVar17[-2] = '\0';
      puVar17[-1] = '\0';
      memcpy(puVar17 + uVar18,puVar21,uVar19);
      if ((char)local_80 != '\x03') {
        uVar14 = 0x63f;
LAB_00178e01:
        puVar17[-8] = '\b';
        puVar17[-7] = 0x8e;
        puVar17[-6] = '\x17';
        puVar17[-5] = '\0';
        puVar17[-4] = '\0';
        puVar17[-3] = '\0';
        puVar17[-2] = '\0';
        puVar17[-1] = '\0';
        printf("KaRaMeL abort at %s:%d\n%s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_DRBG.c"
               ,uVar14,"unreachable (pattern matches are exhaustive in F*)");
        *(code **)(puVar17 + -8) = EverCrypt_DRBG_uninstantiate;
        exit(0xff);
      }
      uVar20 = additional_input_len + uVar12 + 0x41;
      uVar13 = (ulong)uVar20;
      uVar18 = uVar13 + 0xf & 0xfffffffffffffff0;
      puVar22 = puVar17 + -uVar18;
      local_50 = (uint8_t *)uVar19;
      puVar22[-8] = 'r';
      puVar22[-7] = 0x87;
      puVar22[-6] = '\x17';
      puVar22[-5] = '\0';
      puVar22[-4] = '\0';
      puVar22[-3] = '\0';
      puVar22[-2] = '\0';
      puVar22[-1] = '\0';
      memset(puVar22,0,uVar13);
      uVar14 = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 8);
      uVar4 = *(undefined8 *)(puVar1 + 0x10);
      uVar5 = *(undefined8 *)(puVar1 + 0x18);
      uVar6 = *(undefined8 *)(puVar1 + 0x20);
      uVar7 = *(undefined8 *)(puVar1 + 0x28);
      uVar8 = *(undefined8 *)(puVar1 + 0x38);
      *(undefined8 *)(puVar17 + -uVar18 + 0x30) = *(undefined8 *)(puVar1 + 0x30);
      *(undefined8 *)(puVar17 + -uVar18 + 0x30 + 8) = uVar8;
      *(undefined8 *)puVar22 = uVar14;
      *(undefined8 *)(puVar22 + 8) = uVar3;
      *(undefined8 *)(puVar22 + 0x10) = uVar4;
      puVar21 = local_98;
      *(undefined8 *)(puVar22 + 0x18) = uVar5;
      *(undefined8 *)(puVar22 + 0x20) = uVar6;
      puVar17 = local_88;
      *(undefined8 *)(puVar22 + 0x28) = uVar7;
      puVar9 = local_60;
      if (local_60 == (uint *)0x0) {
        puVar22[0x40] = '\0';
        puVar22[-8] = '\t';
        puVar22[-7] = 0x89;
        puVar22[-6] = '\x17';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar22,puVar17,0x40,puVar22,uVar20);
        puVar22[-8] = '\"';
        puVar22[-7] = 0x89;
        puVar22[-6] = '\x17';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar1,puVar22,0x40,puVar1,0x40);
        uVar14 = *(undefined8 *)puVar22;
        uVar3 = *(undefined8 *)(puVar22 + 8);
        uVar4 = *(undefined8 *)(puVar22 + 0x10);
        uVar5 = *(undefined8 *)(puVar22 + 0x18);
        uVar6 = *(undefined8 *)(puVar22 + 0x20);
        uVar7 = *(undefined8 *)(puVar22 + 0x28);
        uVar8 = *(undefined8 *)(puVar22 + 0x38);
        *(undefined8 *)(puVar17 + 0x30) = *(undefined8 *)(puVar22 + 0x30);
        *(undefined8 *)(puVar17 + 0x38) = uVar8;
        *(undefined8 *)(puVar17 + 0x20) = uVar6;
        *(undefined8 *)(puVar17 + 0x28) = uVar7;
        *(undefined8 *)(puVar17 + 0x10) = uVar4;
        *(undefined8 *)(puVar17 + 0x18) = uVar5;
        *(undefined8 *)puVar17 = uVar14;
        *(undefined8 *)(puVar17 + 8) = uVar3;
      }
      else {
        local_80 = -uVar18;
        puVar22[-8] = 0xbe;
        puVar22[-7] = 0x87;
        puVar22[-6] = '\x17';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        memcpy(puVar22 + 0x41,puVar21,(size_t)puVar9);
        puVar17 = local_88;
        puVar22[0x40] = '\0';
        local_a0 = uVar13;
        puVar22[-8] = 0xe4;
        puVar22[-7] = 0x87;
        puVar22[-6] = '\x17';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar22,puVar17,0x40,puVar22,uVar20);
        puVar22[-8] = 0xfd;
        puVar22[-7] = 0x87;
        puVar22[-6] = '\x17';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar1,puVar22,0x40,puVar1,0x40);
        uVar19 = local_a0;
        local_a8 = puVar22;
        uVar14 = *(undefined8 *)puVar22;
        uVar3 = *(undefined8 *)(puVar22 + 8);
        uVar4 = *(undefined8 *)(puVar22 + 0x10);
        uVar5 = *(undefined8 *)(puVar22 + 0x18);
        uVar6 = *(undefined8 *)(puVar22 + 0x20);
        uVar7 = *(undefined8 *)(puVar22 + 0x28);
        uVar8 = *(undefined8 *)(puVar22 + 0x38);
        *(undefined8 *)(puVar17 + 0x30) = *(undefined8 *)(puVar22 + 0x30);
        *(undefined8 *)(puVar17 + 0x38) = uVar8;
        *(undefined8 *)(puVar17 + 0x20) = uVar6;
        *(undefined8 *)(puVar17 + 0x28) = uVar7;
        *(undefined8 *)(puVar17 + 0x10) = uVar4;
        *(undefined8 *)(puVar17 + 0x18) = uVar5;
        *(undefined8 *)puVar17 = uVar14;
        *(undefined8 *)(puVar17 + 8) = uVar3;
        dst = puVar22 + -uVar18;
        dst[-8] = 'K';
        dst[-7] = 0x88;
        dst[-6] = '\x17';
        dst[-5] = '\0';
        dst[-4] = '\0';
        dst[-3] = '\0';
        dst[-2] = '\0';
        dst[-1] = '\0';
        memset(dst,0,uVar19);
        uVar14 = *(undefined8 *)(puVar1 + 8);
        uVar3 = *(undefined8 *)(puVar1 + 0x10);
        uVar4 = *(undefined8 *)(puVar1 + 0x18);
        uVar5 = *(undefined8 *)(puVar1 + 0x20);
        uVar6 = *(undefined8 *)(puVar1 + 0x28);
        uVar7 = *(undefined8 *)(puVar1 + 0x30);
        uVar8 = *(undefined8 *)(puVar1 + 0x38);
        *(undefined8 *)dst = *(undefined8 *)puVar1;
        *(undefined8 *)(dst + 8) = uVar14;
        *(undefined8 *)(dst + 0x10) = uVar3;
        puVar21 = local_98;
        *(undefined8 *)(dst + 0x18) = uVar4;
        *(undefined8 *)(dst + 0x20) = uVar5;
        *(undefined8 *)(dst + 0x28) = uVar6;
        *(undefined8 *)(dst + 0x30) = uVar7;
        *(undefined8 *)(dst + 0x38) = uVar8;
        puVar9 = local_60;
        dst[-8] = 0x81;
        dst[-7] = 0x88;
        dst[-6] = '\x17';
        dst[-5] = '\0';
        dst[-4] = '\0';
        dst[-3] = '\0';
        dst[-2] = '\0';
        dst[-1] = '\0';
        memcpy(dst + 0x41,puVar21,(size_t)puVar9);
        dst[0x40] = '\x01';
        dst[-8] = 0x9c;
        dst[-7] = 0x88;
        dst[-6] = '\x17';
        dst[-5] = '\0';
        dst[-4] = '\0';
        dst[-3] = '\0';
        dst[-2] = '\0';
        dst[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(dst,puVar17,0x40,dst,(uint32_t)uVar19);
        dst[-8] = 0xb5;
        dst[-7] = 0x88;
        dst[-6] = '\x17';
        dst[-5] = '\0';
        dst[-4] = '\0';
        dst[-3] = '\0';
        dst[-2] = '\0';
        dst[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar1,dst,0x40,puVar1,0x40);
        uVar14 = *(undefined8 *)(dst + 0x10);
        uVar3 = *(undefined8 *)(dst + 0x18);
        uVar4 = *(undefined8 *)(dst + 0x20);
        uVar5 = *(undefined8 *)(dst + 0x28);
        uVar6 = *(undefined8 *)(dst + 0x38);
        *(undefined8 *)(puVar17 + 0x30) = *(undefined8 *)(dst + 0x30);
        *(undefined8 *)(puVar17 + 0x38) = uVar6;
        *(undefined8 *)(puVar17 + 0x20) = uVar4;
        *(undefined8 *)(puVar17 + 0x28) = uVar5;
        *(undefined8 *)(puVar17 + 0x10) = uVar14;
        *(undefined8 *)(puVar17 + 0x18) = uVar3;
        uVar14 = *(undefined8 *)(puVar22 + local_80 + 8);
        *(undefined8 *)puVar17 = *(undefined8 *)(puVar22 + local_80);
        *(undefined8 *)(puVar17 + 8) = uVar14;
      }
      *local_90 = 1;
      uVar20 = (uint)local_48;
      if (local_31 == '\0') {
        cVar11 = '\0';
      }
      else {
        if (local_68->tag != '\x03') {
          uVar14 = 0x678;
          puVar17 = local_40;
          goto LAB_00178e01;
        }
        local_60 = (local_68->field_1).case_SHA1_s.reseed_counter;
        cVar11 = *local_60 <= Hacl_HMAC_DRBG_reseed_interval;
        if (*local_60 <= Hacl_HMAC_DRBG_reseed_interval) {
          puVar21 = (local_68->field_1).case_SHA1_s.k;
          puVar1 = (local_68->field_1).case_SHA1_s.v;
          if ((int)local_50 != 0) {
            data_len = (int)local_50 + 0x41;
            uVar18 = (ulong)data_len;
            uVar19 = uVar18 + 0xf & 0xfffffffffffffff0;
            puVar17 = local_40 + -uVar19;
            puVar17[-8] = 0xcd;
            puVar17[-7] = 0x89;
            puVar17[-6] = '\x17';
            puVar17[-5] = '\0';
            puVar17[-4] = '\0';
            puVar17[-3] = '\0';
            puVar17[-2] = '\0';
            puVar17[-1] = '\0';
            memset(puVar17,0,uVar18);
            uVar14 = *(undefined8 *)(puVar1 + 8);
            uVar3 = *(undefined8 *)(puVar1 + 0x10);
            uVar4 = *(undefined8 *)(puVar1 + 0x18);
            uVar5 = *(undefined8 *)(puVar1 + 0x20);
            uVar6 = *(undefined8 *)(puVar1 + 0x28);
            uVar7 = *(undefined8 *)(puVar1 + 0x30);
            uVar8 = *(undefined8 *)(puVar1 + 0x38);
            *(undefined8 *)puVar17 = *(undefined8 *)puVar1;
            *(undefined8 *)(puVar17 + 8) = uVar14;
            *(undefined8 *)(puVar17 + 0x10) = uVar3;
            *(undefined8 *)(puVar17 + 0x18) = uVar4;
            *(undefined8 *)(puVar17 + 0x20) = uVar5;
            *(undefined8 *)(puVar17 + 0x28) = uVar6;
            *(undefined8 *)(puVar17 + 0x30) = uVar7;
            *(undefined8 *)(puVar17 + 0x38) = uVar8;
            puVar17[-8] = '\x01';
            puVar17[-7] = 0x8a;
            puVar17[-6] = '\x17';
            puVar17[-5] = '\0';
            puVar17[-4] = '\0';
            puVar17[-3] = '\0';
            puVar17[-2] = '\0';
            puVar17[-1] = '\0';
            memcpy(puVar17 + 0x41,local_58,local_70);
            puVar17[0x40] = '\0';
            puVar17[-8] = '\x1c';
            puVar17[-7] = 0x8a;
            puVar17[-6] = '\x17';
            puVar17[-5] = '\0';
            puVar17[-4] = '\0';
            puVar17[-3] = '\0';
            puVar17[-2] = '\0';
            puVar17[-1] = '\0';
            EverCrypt_HMAC_compute_sha2_512(puVar17,puVar21,0x40,puVar17,data_len);
            puVar17[-8] = '5';
            puVar17[-7] = 0x8a;
            puVar17[-6] = '\x17';
            puVar17[-5] = '\0';
            puVar17[-4] = '\0';
            puVar17[-3] = '\0';
            puVar17[-2] = '\0';
            puVar17[-1] = '\0';
            EverCrypt_HMAC_compute_sha2_512(puVar1,puVar17,0x40,puVar1,0x40);
            uVar14 = *(undefined8 *)puVar17;
            uVar3 = *(undefined8 *)(puVar17 + 8);
            uVar4 = *(undefined8 *)(puVar17 + 0x10);
            uVar5 = *(undefined8 *)(puVar17 + 0x18);
            uVar6 = *(undefined8 *)(puVar17 + 0x20);
            uVar7 = *(undefined8 *)(puVar17 + 0x28);
            uVar8 = *(undefined8 *)(puVar17 + 0x38);
            *(undefined8 *)(puVar21 + 0x30) = *(undefined8 *)(puVar17 + 0x30);
            *(undefined8 *)(puVar21 + 0x38) = uVar8;
            *(undefined8 *)(puVar21 + 0x20) = uVar6;
            *(undefined8 *)(puVar21 + 0x28) = uVar7;
            *(undefined8 *)(puVar21 + 0x10) = uVar4;
            *(undefined8 *)(puVar21 + 0x18) = uVar5;
            *(undefined8 *)puVar21 = uVar14;
            *(undefined8 *)(puVar21 + 8) = uVar3;
            puVar17 = puVar17 + -uVar19;
            puVar17[-8] = 'r';
            puVar17[-7] = 0x8a;
            puVar17[-6] = '\x17';
            puVar17[-5] = '\0';
            puVar17[-4] = '\0';
            puVar17[-3] = '\0';
            puVar17[-2] = '\0';
            puVar17[-1] = '\0';
            memset(puVar17,0,uVar18);
            uVar14 = *(undefined8 *)(puVar1 + 8);
            uVar3 = *(undefined8 *)(puVar1 + 0x10);
            uVar4 = *(undefined8 *)(puVar1 + 0x18);
            uVar5 = *(undefined8 *)(puVar1 + 0x20);
            uVar6 = *(undefined8 *)(puVar1 + 0x28);
            uVar7 = *(undefined8 *)(puVar1 + 0x30);
            uVar8 = *(undefined8 *)(puVar1 + 0x38);
            *(undefined8 *)puVar17 = *(undefined8 *)puVar1;
            *(undefined8 *)(puVar17 + 8) = uVar14;
            *(undefined8 *)(puVar17 + 0x10) = uVar3;
            *(undefined8 *)(puVar17 + 0x18) = uVar4;
            *(undefined8 *)(puVar17 + 0x20) = uVar5;
            *(undefined8 *)(puVar17 + 0x28) = uVar6;
            *(undefined8 *)(puVar17 + 0x30) = uVar7;
            *(undefined8 *)(puVar17 + 0x38) = uVar8;
            puVar17[-8] = 0xa6;
            puVar17[-7] = 0x8a;
            puVar17[-6] = '\x17';
            puVar17[-5] = '\0';
            puVar17[-4] = '\0';
            puVar17[-3] = '\0';
            puVar17[-2] = '\0';
            puVar17[-1] = '\0';
            memcpy(puVar17 + 0x41,local_58,local_70);
            puVar17[0x40] = '\x01';
            uVar20 = (uint)local_48;
            puVar17[-8] = 0xc5;
            puVar17[-7] = 0x8a;
            puVar17[-6] = '\x17';
            puVar17[-5] = '\0';
            puVar17[-4] = '\0';
            puVar17[-3] = '\0';
            puVar17[-2] = '\0';
            puVar17[-1] = '\0';
            EverCrypt_HMAC_compute_sha2_512(puVar17,puVar21,0x40,puVar17,data_len);
            puVar17[-8] = 0xde;
            puVar17[-7] = 0x8a;
            puVar17[-6] = '\x17';
            puVar17[-5] = '\0';
            puVar17[-4] = '\0';
            puVar17[-3] = '\0';
            puVar17[-2] = '\0';
            puVar17[-1] = '\0';
            EverCrypt_HMAC_compute_sha2_512(puVar1,puVar17,0x40,puVar1,0x40);
            uVar14 = *(undefined8 *)puVar17;
            uVar3 = *(undefined8 *)(puVar17 + 8);
            uVar4 = *(undefined8 *)(puVar17 + 0x10);
            uVar5 = *(undefined8 *)(puVar17 + 0x18);
            uVar6 = *(undefined8 *)(puVar17 + 0x20);
            uVar7 = *(undefined8 *)(puVar17 + 0x28);
            uVar8 = *(undefined8 *)(puVar17 + 0x38);
            *(undefined8 *)(puVar21 + 0x30) = *(undefined8 *)(puVar17 + 0x30);
            *(undefined8 *)(puVar21 + 0x38) = uVar8;
            *(undefined8 *)(puVar21 + 0x20) = uVar6;
            *(undefined8 *)(puVar21 + 0x28) = uVar7;
            *(undefined8 *)(puVar21 + 0x10) = uVar4;
            *(undefined8 *)(puVar21 + 0x18) = uVar5;
            *(undefined8 *)puVar21 = uVar14;
            *(undefined8 *)(puVar21 + 8) = uVar3;
          }
          puVar10 = local_40;
          puVar17 = local_78;
          if (0x3f < uVar20) {
            uVar20 = (uint)local_48;
            uVar19 = 0;
            do {
              *(undefined8 *)(puVar10 + -8) = 0x178b37;
              EverCrypt_HMAC_compute_sha2_512(puVar1,puVar21,0x40,puVar1,0x40);
              uVar14 = *(undefined8 *)puVar1;
              uVar3 = *(undefined8 *)(puVar1 + 8);
              uVar4 = *(undefined8 *)(puVar1 + 0x10);
              uVar5 = *(undefined8 *)(puVar1 + 0x18);
              uVar6 = *(undefined8 *)(puVar1 + 0x20);
              uVar7 = *(undefined8 *)(puVar1 + 0x28);
              uVar8 = *(undefined8 *)(puVar1 + 0x38);
              *(undefined8 *)(puVar17 + uVar19 + 0x30) = *(undefined8 *)(puVar1 + 0x30);
              *(undefined8 *)(puVar17 + uVar19 + 0x30 + 8) = uVar8;
              *(undefined8 *)(puVar17 + uVar19 + 0x20) = uVar6;
              *(undefined8 *)(puVar17 + uVar19 + 0x20 + 8) = uVar7;
              *(undefined8 *)(puVar17 + uVar19 + 0x10) = uVar4;
              *(undefined8 *)(puVar17 + uVar19 + 0x10 + 8) = uVar5;
              *(undefined8 *)(puVar17 + uVar19) = uVar14;
              *(undefined8 *)(puVar17 + uVar19 + 8) = uVar3;
              uVar19 = uVar19 + 0x40;
            } while ((uVar20 & 0xffffffc0) != uVar19);
          }
          uVar20 = (uint)local_48;
          if ((uVar20 & 0xffffffc0) != uVar20) {
            puVar17 = local_78 + (uVar20 & 0xffffffc0);
            *(undefined8 *)(puVar10 + -8) = 0x178b98;
            EverCrypt_HMAC_compute_sha2_512(puVar1,puVar21,0x40,puVar1,0x40);
            *(undefined8 *)(puVar10 + -8) = 0x178baa;
            memcpy(puVar17,puVar1,(ulong)(uVar20 & 0x3f));
          }
          uVar19 = (ulong)((int)local_50 + 0x41);
          uVar18 = uVar19 + 0xf & 0xfffffffffffffff0;
          puVar17 = puVar10 + -uVar18;
          puVar17[-8] = 0xd7;
          puVar17[-7] = 0x8b;
          puVar17[-6] = '\x17';
          puVar17[-5] = '\0';
          puVar17[-4] = '\0';
          puVar17[-3] = '\0';
          puVar17[-2] = '\0';
          puVar17[-1] = '\0';
          local_68 = (EverCrypt_DRBG_state_s *)uVar19;
          local_40 = puVar10;
          memset(puVar17,0,uVar19);
          uVar14 = *(undefined8 *)puVar1;
          uVar3 = *(undefined8 *)(puVar1 + 8);
          uVar4 = *(undefined8 *)(puVar1 + 0x10);
          uVar5 = *(undefined8 *)(puVar1 + 0x18);
          uVar6 = *(undefined8 *)(puVar1 + 0x20);
          uVar7 = *(undefined8 *)(puVar1 + 0x28);
          uVar8 = *(undefined8 *)(puVar1 + 0x38);
          *(undefined8 *)(puVar10 + -uVar18 + 0x30) = *(undefined8 *)(puVar1 + 0x30);
          *(undefined8 *)((long)(puVar10 + -uVar18 + 0x30) + 8) = uVar8;
          *(undefined8 *)puVar17 = uVar14;
          *(undefined8 *)(puVar17 + 8) = uVar3;
          *(undefined8 *)(puVar17 + 0x10) = uVar4;
          *(undefined8 *)(puVar17 + 0x18) = uVar5;
          *(undefined8 *)(puVar17 + 0x20) = uVar6;
          *(undefined8 *)(puVar17 + 0x28) = uVar7;
          if ((int)local_50 == 0) {
            puVar17[0x40] = '\0';
            puVar17[-8] = 'i';
            puVar17[-7] = 0x8d;
            puVar17[-6] = '\x17';
            puVar17[-5] = '\0';
            puVar17[-4] = '\0';
            puVar17[-3] = '\0';
            puVar17[-2] = '\0';
            puVar17[-1] = '\0';
            EverCrypt_HMAC_compute_sha2_512(puVar17,puVar21,0x40,puVar17,(uint32_t)local_68);
            puVar17[-8] = 0x82;
            puVar17[-7] = 0x8d;
            puVar17[-6] = '\x17';
            puVar17[-5] = '\0';
            puVar17[-4] = '\0';
            puVar17[-3] = '\0';
            puVar17[-2] = '\0';
            puVar17[-1] = '\0';
            EverCrypt_HMAC_compute_sha2_512(puVar1,puVar17,0x40,puVar1,0x40);
            uVar14 = *(undefined8 *)puVar17;
            uVar3 = *(undefined8 *)(puVar17 + 8);
            uVar4 = *(undefined8 *)(puVar17 + 0x10);
            uVar5 = *(undefined8 *)(puVar17 + 0x18);
            uVar6 = *(undefined8 *)(puVar17 + 0x20);
            uVar7 = *(undefined8 *)(puVar17 + 0x28);
            uVar8 = *(undefined8 *)(puVar17 + 0x38);
            *(undefined8 *)(puVar21 + 0x30) = *(undefined8 *)(puVar17 + 0x30);
            *(undefined8 *)(puVar21 + 0x38) = uVar8;
            *(undefined8 *)(puVar21 + 0x20) = uVar6;
            *(undefined8 *)(puVar21 + 0x28) = uVar7;
            *(undefined8 *)(puVar21 + 0x10) = uVar4;
            *(undefined8 *)(puVar21 + 0x18) = uVar5;
            *(undefined8 *)puVar21 = uVar14;
            *(undefined8 *)(puVar21 + 8) = uVar3;
          }
          else {
            puVar17[-8] = '#';
            puVar17[-7] = 0x8c;
            puVar17[-6] = '\x17';
            puVar17[-5] = '\0';
            puVar17[-4] = '\0';
            puVar17[-3] = '\0';
            puVar17[-2] = '\0';
            puVar17[-1] = '\0';
            local_48 = -uVar18;
            memcpy(puVar17 + 0x41,local_58,local_70);
            __n = (size_t)local_68;
            puVar17[0x40] = '\0';
            uVar12 = (uint32_t)local_68;
            puVar17[-8] = 'C';
            puVar17[-7] = 0x8c;
            puVar17[-6] = '\x17';
            puVar17[-5] = '\0';
            puVar17[-4] = '\0';
            puVar17[-3] = '\0';
            puVar17[-2] = '\0';
            puVar17[-1] = '\0';
            EverCrypt_HMAC_compute_sha2_512(puVar17,puVar21,0x40,puVar17,uVar12);
            puVar17[-8] = '\\';
            puVar17[-7] = 0x8c;
            puVar17[-6] = '\x17';
            puVar17[-5] = '\0';
            puVar17[-4] = '\0';
            puVar17[-3] = '\0';
            puVar17[-2] = '\0';
            puVar17[-1] = '\0';
            EverCrypt_HMAC_compute_sha2_512(puVar1,puVar17,0x40,puVar1,0x40);
            uVar14 = *(undefined8 *)puVar17;
            uVar3 = *(undefined8 *)(puVar17 + 8);
            uVar4 = *(undefined8 *)(puVar17 + 0x10);
            uVar5 = *(undefined8 *)(puVar17 + 0x18);
            uVar6 = *(undefined8 *)(puVar17 + 0x20);
            uVar7 = *(undefined8 *)(puVar17 + 0x28);
            uVar8 = *(undefined8 *)(puVar17 + 0x38);
            *(undefined8 *)(puVar21 + 0x30) = *(undefined8 *)(puVar17 + 0x30);
            *(undefined8 *)(puVar21 + 0x38) = uVar8;
            *(undefined8 *)(puVar21 + 0x20) = uVar6;
            *(undefined8 *)(puVar21 + 0x28) = uVar7;
            *(undefined8 *)(puVar21 + 0x10) = uVar4;
            *(undefined8 *)(puVar21 + 0x18) = uVar5;
            *(undefined8 *)puVar21 = uVar14;
            *(undefined8 *)(puVar21 + 8) = uVar3;
            puVar22 = puVar17 + -uVar18;
            puVar22[-8] = 0xa4;
            puVar22[-7] = 0x8c;
            puVar22[-6] = '\x17';
            puVar22[-5] = '\0';
            puVar22[-4] = '\0';
            puVar22[-3] = '\0';
            puVar22[-2] = '\0';
            puVar22[-1] = '\0';
            local_78 = puVar17;
            local_50 = puVar17;
            memset(puVar22,0,__n);
            uVar14 = *(undefined8 *)(puVar1 + 8);
            uVar3 = *(undefined8 *)(puVar1 + 0x10);
            uVar4 = *(undefined8 *)(puVar1 + 0x18);
            uVar5 = *(undefined8 *)(puVar1 + 0x20);
            uVar6 = *(undefined8 *)(puVar1 + 0x28);
            uVar7 = *(undefined8 *)(puVar1 + 0x30);
            uVar8 = *(undefined8 *)(puVar1 + 0x38);
            *(undefined8 *)puVar22 = *(undefined8 *)puVar1;
            *(undefined8 *)(puVar22 + 8) = uVar14;
            *(undefined8 *)(puVar22 + 0x10) = uVar3;
            *(undefined8 *)(puVar22 + 0x18) = uVar4;
            *(undefined8 *)(puVar22 + 0x20) = uVar5;
            *(undefined8 *)(puVar22 + 0x28) = uVar6;
            *(undefined8 *)(puVar22 + 0x30) = uVar7;
            *(undefined8 *)(puVar22 + 0x38) = uVar8;
            puVar22[-8] = 0xdc;
            puVar22[-7] = 0x8c;
            puVar22[-6] = '\x17';
            puVar22[-5] = '\0';
            puVar22[-4] = '\0';
            puVar22[-3] = '\0';
            puVar22[-2] = '\0';
            puVar22[-1] = '\0';
            memcpy(puVar22 + 0x41,local_58,local_70);
            puVar22[0x40] = '\x01';
            puVar22[-8] = 0xf8;
            puVar22[-7] = 0x8c;
            puVar22[-6] = '\x17';
            puVar22[-5] = '\0';
            puVar22[-4] = '\0';
            puVar22[-3] = '\0';
            puVar22[-2] = '\0';
            puVar22[-1] = '\0';
            EverCrypt_HMAC_compute_sha2_512(puVar22,puVar21,0x40,puVar22,uVar12);
            puVar22[-8] = '\x11';
            puVar22[-7] = 0x8d;
            puVar22[-6] = '\x17';
            puVar22[-5] = '\0';
            puVar22[-4] = '\0';
            puVar22[-3] = '\0';
            puVar22[-2] = '\0';
            puVar22[-1] = '\0';
            EverCrypt_HMAC_compute_sha2_512(puVar1,puVar22,0x40,puVar1,0x40);
            uVar14 = *(undefined8 *)(puVar22 + 0x10);
            uVar3 = *(undefined8 *)(puVar22 + 0x18);
            uVar4 = *(undefined8 *)(puVar22 + 0x20);
            uVar5 = *(undefined8 *)(puVar22 + 0x28);
            uVar6 = *(undefined8 *)(puVar22 + 0x38);
            *(undefined8 *)(puVar21 + 0x30) = *(undefined8 *)(puVar22 + 0x30);
            *(undefined8 *)(puVar21 + 0x38) = uVar6;
            *(undefined8 *)(puVar21 + 0x20) = uVar4;
            *(undefined8 *)(puVar21 + 0x28) = uVar5;
            *(undefined8 *)(puVar21 + 0x10) = uVar14;
            *(undefined8 *)(puVar21 + 0x18) = uVar3;
            uVar14 = *(undefined8 *)(local_50 + local_48 + 8);
            *(undefined8 *)puVar21 = *(undefined8 *)(local_50 + local_48);
            *(undefined8 *)(puVar21 + 8) = uVar14;
          }
          *local_60 = *local_60 + 1;
          cVar11 = local_31;
        }
      }
    }
  }
  return (_Bool)cVar11;
}

Assistant:

static bool
generate_sha2_512(
  uint8_t *output,
  EverCrypt_DRBG_state_s *st,
  uint32_t n,
  uint8_t *additional_input,
  uint32_t additional_input_len
)
{
  if
  (
    additional_input_len
    > Hacl_HMAC_DRBG_max_additional_input_length
    || n > Hacl_HMAC_DRBG_max_output_length
  )
  {
    return false;
  }
  bool ok0;
  if (additional_input_len > Hacl_HMAC_DRBG_max_additional_input_length)
  {
    ok0 = false;
  }
  else
  {
    uint32_t entropy_input_len = Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_SHA2_512);
    KRML_CHECK_SIZE(sizeof (uint8_t), entropy_input_len);
    uint8_t entropy_input[entropy_input_len];
    memset(entropy_input, 0U, entropy_input_len * sizeof (uint8_t));
    bool ok = Lib_RandomBuffer_System_randombytes(entropy_input, entropy_input_len);
    bool result;
    if (!ok)
    {
      result = false;
    }
    else
    {
      EverCrypt_DRBG_state_s st_s = *st;
      KRML_CHECK_SIZE(sizeof (uint8_t), entropy_input_len + additional_input_len);
      uint8_t seed_material[entropy_input_len + additional_input_len];
      memset(seed_material, 0U, (entropy_input_len + additional_input_len) * sizeof (uint8_t));
      memcpy(seed_material, entropy_input, entropy_input_len * sizeof (uint8_t));
      memcpy(seed_material + entropy_input_len,
        additional_input,
        additional_input_len * sizeof (uint8_t));
      Hacl_HMAC_DRBG_state scrut;
      if (st_s.tag == SHA2_512_s)
      {
        scrut = st_s.case_SHA2_512_s;
      }
      else
      {
        scrut =
          KRML_EABORT(Hacl_HMAC_DRBG_state,
            "unreachable (pattern matches are exhaustive in F*)");
      }
      uint8_t *k = scrut.k;
      uint8_t *v = scrut.v;
      uint32_t *ctr = scrut.reseed_counter;
      uint32_t input_len = 65U + entropy_input_len + additional_input_len;
      KRML_CHECK_SIZE(sizeof (uint8_t), input_len);
      uint8_t input0[input_len];
      memset(input0, 0U, input_len * sizeof (uint8_t));
      uint8_t *k_ = input0;
      memcpy(k_, v, 64U * sizeof (uint8_t));
      if (entropy_input_len + additional_input_len != 0U)
      {
        memcpy(input0 + 65U,
          seed_material,
          (entropy_input_len + additional_input_len) * sizeof (uint8_t));
      }
      input0[64U] = 0U;
      EverCrypt_HMAC_compute_sha2_512(k_, k, 64U, input0, input_len);
      EverCrypt_HMAC_compute_sha2_512(v, k_, 64U, v, 64U);
      memcpy(k, k_, 64U * sizeof (uint8_t));
      if (entropy_input_len + additional_input_len != 0U)
      {
        uint32_t input_len0 = 65U + entropy_input_len + additional_input_len;
        KRML_CHECK_SIZE(sizeof (uint8_t), input_len0);
        uint8_t input[input_len0];
        memset(input, 0U, input_len0 * sizeof (uint8_t));
        uint8_t *k_0 = input;
        memcpy(k_0, v, 64U * sizeof (uint8_t));
        if (entropy_input_len + additional_input_len != 0U)
        {
          memcpy(input + 65U,
            seed_material,
            (entropy_input_len + additional_input_len) * sizeof (uint8_t));
        }
        input[64U] = 1U;
        EverCrypt_HMAC_compute_sha2_512(k_0, k, 64U, input, input_len0);
        EverCrypt_HMAC_compute_sha2_512(v, k_0, 64U, v, 64U);
        memcpy(k, k_0, 64U * sizeof (uint8_t));
      }
      ctr[0U] = 1U;
      result = true;
    }
    ok0 = result;
  }
  if (!ok0)
  {
    return false;
  }
  EverCrypt_DRBG_state_s st_s = *st;
  Hacl_HMAC_DRBG_state ite;
  if (st_s.tag == SHA2_512_s)
  {
    ite = st_s.case_SHA2_512_s;
  }
  else
  {
    ite = KRML_EABORT(Hacl_HMAC_DRBG_state, "unreachable (pattern matches are exhaustive in F*)");
  }
  if (ite.reseed_counter[0U] > Hacl_HMAC_DRBG_reseed_interval)
  {
    return false;
  }
  Hacl_HMAC_DRBG_state scrut;
  if (st_s.tag == SHA2_512_s)
  {
    scrut = st_s.case_SHA2_512_s;
  }
  else
  {
    scrut = KRML_EABORT(Hacl_HMAC_DRBG_state, "unreachable (pattern matches are exhaustive in F*)");
  }
  uint8_t *k = scrut.k;
  uint8_t *v = scrut.v;
  uint32_t *ctr = scrut.reseed_counter;
  if (additional_input_len > 0U)
  {
    uint32_t input_len = 65U + additional_input_len;
    KRML_CHECK_SIZE(sizeof (uint8_t), input_len);
    uint8_t input0[input_len];
    memset(input0, 0U, input_len * sizeof (uint8_t));
    uint8_t *k_ = input0;
    memcpy(k_, v, 64U * sizeof (uint8_t));
    if (additional_input_len != 0U)
    {
      memcpy(input0 + 65U, additional_input, additional_input_len * sizeof (uint8_t));
    }
    input0[64U] = 0U;
    EverCrypt_HMAC_compute_sha2_512(k_, k, 64U, input0, input_len);
    EverCrypt_HMAC_compute_sha2_512(v, k_, 64U, v, 64U);
    memcpy(k, k_, 64U * sizeof (uint8_t));
    if (additional_input_len != 0U)
    {
      uint32_t input_len0 = 65U + additional_input_len;
      KRML_CHECK_SIZE(sizeof (uint8_t), input_len0);
      uint8_t input[input_len0];
      memset(input, 0U, input_len0 * sizeof (uint8_t));
      uint8_t *k_0 = input;
      memcpy(k_0, v, 64U * sizeof (uint8_t));
      if (additional_input_len != 0U)
      {
        memcpy(input + 65U, additional_input, additional_input_len * sizeof (uint8_t));
      }
      input[64U] = 1U;
      EverCrypt_HMAC_compute_sha2_512(k_0, k, 64U, input, input_len0);
      EverCrypt_HMAC_compute_sha2_512(v, k_0, 64U, v, 64U);
      memcpy(k, k_0, 64U * sizeof (uint8_t));
    }
  }
  uint8_t *output1 = output;
  uint32_t max = n / 64U;
  uint8_t *out = output1;
  for (uint32_t i = 0U; i < max; i++)
  {
    EverCrypt_HMAC_compute_sha2_512(v, k, 64U, v, 64U);
    memcpy(out + i * 64U, v, 64U * sizeof (uint8_t));
  }
  if (max * 64U < n)
  {
    uint8_t *block = output1 + max * 64U;
    EverCrypt_HMAC_compute_sha2_512(v, k, 64U, v, 64U);
    memcpy(block, v, (n - max * 64U) * sizeof (uint8_t));
  }
  uint32_t input_len = 65U + additional_input_len;
  KRML_CHECK_SIZE(sizeof (uint8_t), input_len);
  uint8_t input0[input_len];
  memset(input0, 0U, input_len * sizeof (uint8_t));
  uint8_t *k_ = input0;
  memcpy(k_, v, 64U * sizeof (uint8_t));
  if (additional_input_len != 0U)
  {
    memcpy(input0 + 65U, additional_input, additional_input_len * sizeof (uint8_t));
  }
  input0[64U] = 0U;
  EverCrypt_HMAC_compute_sha2_512(k_, k, 64U, input0, input_len);
  EverCrypt_HMAC_compute_sha2_512(v, k_, 64U, v, 64U);
  memcpy(k, k_, 64U * sizeof (uint8_t));
  if (additional_input_len != 0U)
  {
    uint32_t input_len0 = 65U + additional_input_len;
    KRML_CHECK_SIZE(sizeof (uint8_t), input_len0);
    uint8_t input[input_len0];
    memset(input, 0U, input_len0 * sizeof (uint8_t));
    uint8_t *k_0 = input;
    memcpy(k_0, v, 64U * sizeof (uint8_t));
    if (additional_input_len != 0U)
    {
      memcpy(input + 65U, additional_input, additional_input_len * sizeof (uint8_t));
    }
    input[64U] = 1U;
    EverCrypt_HMAC_compute_sha2_512(k_0, k, 64U, input, input_len0);
    EverCrypt_HMAC_compute_sha2_512(v, k_0, 64U, v, 64U);
    memcpy(k, k_0, 64U * sizeof (uint8_t));
  }
  uint32_t old_ctr = ctr[0U];
  ctr[0U] = old_ctr + 1U;
  return true;
}